

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O3

result<sockpp::stream_socket> *
sockpp::stream_socket::create
          (result<sockpp::stream_socket> *__return_storage_ptr__,int domain,int protocol)

{
  error_category *peVar1;
  result<int> res;
  result<int> local_50;
  undefined **local_38;
  undefined4 local_30;
  socket local_28;
  
  socket::create_handle(&local_50,domain,1,protocol);
  if (local_50.err_._M_value == 0) {
    (__return_storage_ptr__->val_).super_socket.handle_ = local_50.val_;
    local_30 = 0xffffffff;
    (__return_storage_ptr__->val_).super_socket._vptr_socket = (_func_int **)&PTR__socket_0010bc58;
    (__return_storage_ptr__->err_)._M_value = 0;
    peVar1 = (error_category *)std::_V2::system_category();
    (__return_storage_ptr__->err_)._M_cat = peVar1;
    local_38 = &PTR__socket_0010bba0;
    socket::close(&local_28,(int)&local_38);
  }
  else {
    (__return_storage_ptr__->val_).super_socket.handle_ = -1;
    (__return_storage_ptr__->val_).super_socket._vptr_socket = (_func_int **)&PTR__socket_0010bc58;
    *(ulong *)&__return_storage_ptr__->err_ = CONCAT44(local_50.err_._4_4_,local_50.err_._M_value);
    (__return_storage_ptr__->err_)._M_cat = local_50.err_._M_cat;
  }
  return __return_storage_ptr__;
}

Assistant:

result<stream_socket> stream_socket::create(int domain, int protocol /*=0*/) {
    if (auto res = create_handle(domain, protocol); !res)
        return res.error();
    else
        return stream_socket{res.value()};
}